

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O1

int X509_NAME_get0_der(X509_NAME *nm,uchar **out_der,size_t *out_der_len)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = ASN1_item_i2d((ASN1_VALUE *)nm,(uchar **)0x0,(ASN1_ITEM *)&X509_NAME_it);
  if (0 < iVar1) {
    if (out_der != (uchar **)0x0) {
      *out_der = (uchar *)nm->bytes->data;
    }
    iVar2 = 1;
    if (out_der_len != (size_t *)0x0) {
      *out_der_len = nm->bytes->length;
    }
  }
  return iVar2;
}

Assistant:

int X509_NAME_get0_der(X509_NAME *nm, const unsigned char **out_der,
                       size_t *out_der_len) {
  // Make sure encoding is valid
  if (i2d_X509_NAME(nm, NULL) <= 0) {
    return 0;
  }
  if (out_der != NULL) {
    *out_der = (unsigned char *)nm->bytes->data;
  }
  if (out_der_len != NULL) {
    *out_der_len = nm->bytes->length;
  }
  return 1;
}